

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O0

size_t Assimp::Write<aiColor3D>(IOStream *stream,aiColor3D *v)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t t;
  aiColor3D *v_local;
  IOStream *stream_local;
  
  sVar1 = Write<float>(stream,&v->r);
  sVar2 = Write<float>(stream,&v->g);
  sVar3 = Write<float>(stream,&v->b);
  return sVar3 + sVar2 + sVar1;
}

Assistant:

inline
size_t Write<aiColor3D>(IOStream * stream, const aiColor3D& v) {
    size_t t = Write<float>(stream,v.r);
    t += Write<float>(stream,v.g);
    t += Write<float>(stream,v.b);

    return t;
}